

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

int lj_cconv_compatptr(CTState *cts,CType *d,CType *s,CTInfo flags)

{
  CType *d_00;
  uint uVar1;
  CType *pCVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (d == s || (flags & 1) != 0) {
    return 1;
  }
  pCVar2 = cts->tab;
  uVar7 = (ulong)(ushort)d->info;
  uVar6 = 0;
  while( true ) {
    do {
      uVar5 = uVar7 & 0xffff;
      uVar1 = pCVar2[uVar5].info;
      uVar7 = (ulong)uVar1;
      uVar8 = uVar1 >> 0x1c;
    } while (uVar8 == 5);
    d_00 = pCVar2 + uVar5;
    if (uVar8 != 8) break;
    if ((uVar1 & 0xff0000) == 0x10000) {
      uVar6 = uVar6 | d_00->size;
    }
  }
  uVar9 = s->info;
  uVar10 = 0;
  if ((uVar9 & 0xf0000000) != 0x10000000) {
    uVar10 = 0;
    while( true ) {
      do {
        uVar4 = uVar9 & 0xffff;
        uVar9 = pCVar2[uVar4].info;
      } while (uVar9 >> 0x1c == 5);
      s = pCVar2 + uVar4;
      if (uVar9 >> 0x1c != 8) break;
      if ((uVar9 & 0xff0000) == 0x10000) {
        uVar10 = uVar10 | s->size;
      }
    }
    uVar10 = uVar9 & 0x3000000 | uVar10;
  }
  uVar6 = uVar1 & 0x3000000 | uVar6;
  if ((flags & 4) == 0) {
    if ((flags & 8) == 0) {
      if ((uVar10 & ~uVar6) == 0) {
        if ((uVar1 & 0xf0000000) == 0x40000000) {
          return 1;
        }
        if ((uVar9 & 0xf0000000) == 0x40000000) {
          return 1;
        }
        goto LAB_0014a3e3;
      }
    }
    else {
LAB_0014a3e3:
      if (uVar8 == uVar9 >> 0x1c) goto LAB_0014a407;
    }
    iVar3 = 0;
  }
  else {
    if (uVar6 != uVar10) {
      return 0;
    }
    if (uVar8 != uVar9 >> 0x1c) {
      return 0;
    }
LAB_0014a407:
    iVar3 = 0;
    if (d_00->size == s->size) {
      iVar3 = 0;
      if (uVar1 < 0x10000000) {
        if (((uVar9 ^ uVar1) & 0xc000000) == 0) {
          return 1;
        }
      }
      else if ((uVar1 & 0xe0000000) == 0x20000000) {
        iVar3 = lj_cconv_compatptr(cts,d_00,s,flags | 4);
      }
      else {
        if (uVar8 != 1) {
          return 1;
        }
        if (d_00 == s) {
          return 1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int lj_cconv_compatptr(CTState *cts, CType *d, CType *s, CTInfo flags)
{
  if (!((flags & CCF_CAST) || d == s)) {
    CTInfo dqual = 0, squal = 0;
    d = cconv_childqual(cts, d, &dqual);
    if (!ctype_isstruct(s->info))
      s = cconv_childqual(cts, s, &squal);
    if ((flags & CCF_SAME)) {
      if (dqual != squal)
	return 0;  /* Different qualifiers. */
    } else if (!(flags & CCF_IGNQUAL)) {
      if ((dqual & squal) != squal)
	return 0;  /* Discarded qualifiers. */
      if (ctype_isvoid(d->info) || ctype_isvoid(s->info))
	return 1;  /* Converting to/from void * is always ok. */
    }
    if (ctype_type(d->info) != ctype_type(s->info) ||
	d->size != s->size)
      return 0;  /* Different type or different size. */
    if (ctype_isnum(d->info)) {
      if (((d->info ^ s->info) & (CTF_BOOL|CTF_FP)))
	return 0;  /* Different numeric types. */
    } else if (ctype_ispointer(d->info)) {
      /* Check child types for compatibility. */
      return lj_cconv_compatptr(cts, d, s, flags|CCF_SAME);
    } else if (ctype_isstruct(d->info)) {
      if (d != s)
	return 0;  /* Must be exact same type for struct/union. */
    } else if (ctype_isfunc(d->info)) {
      /* NYI: structural equality of functions. */
    }
  }
  return 1;  /* Types are compatible. */
}